

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

string * __thiscall
gmlc::utilities::base64_decode_to_string_abi_cxx11_
          (string *__return_storage_ptr__,utilities *this,string_view encoded_string,size_t offset)

{
  utilities uVar1;
  char cVar2;
  byte bVar3;
  undefined4 uVar4;
  string *this_00;
  long lVar5;
  long lVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  char cVar10;
  uint uVar11;
  utilities *puVar12;
  ulong uVar13;
  array<unsigned_char,_3UL> char_array_3;
  array<unsigned_char,_4UL> char_array_4;
  undefined2 local_58;
  char local_56;
  undefined4 local_54;
  string *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  utilities *local_40;
  long local_38;
  
  uVar7 = 0;
  local_56 = '\0';
  local_58 = 0;
  local_54 = 0;
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50 = __return_storage_ptr__;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(size_type)this);
  bVar9 = (byte)local_58;
  if (this != (utilities *)0x0) {
    lVar6 = encoded_string._M_len + (long)(int)encoded_string._M_str;
    puVar12 = (utilities *)0x0;
    uVar7 = 0;
    local_38 = lVar6;
    local_40 = this;
    bVar8 = local_58._1_1_;
    cVar10 = local_56;
    do {
      this_00 = local_50;
      uVar1 = puVar12[lVar6];
      if (((ulong)(byte)uVar1 == 0x3d) ||
         (*(char *)((long)&std::__ioinit + (ulong)(byte)uVar1 + 1) == -1)) break;
      lVar5 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      *(utilities *)((long)&local_54 + lVar5) = uVar1;
      uVar4 = local_54;
      if (uVar7 == 4) {
        cVar2 = *(char *)((long)&std::__ioinit + (ulong)(byte)local_54 + 1);
        bVar8 = *(byte *)((long)&std::__ioinit + (ulong)local_54._1_1_ + 1);
        local_54._0_2_ = CONCAT11(bVar8,cVar2);
        local_54._2_1_ = SUB41(uVar4,2);
        bVar3 = *(byte *)((long)&std::__ioinit + (ulong)local_54._2_1_ + 1);
        local_54._3_1_ = SUB41(uVar4,3);
        local_54._0_3_ = CONCAT12(bVar3,(undefined2)local_54);
        cVar10 = *(char *)((long)&std::__ioinit + (ulong)local_54._3_1_ + 1);
        local_54 = CONCAT13(cVar10,(undefined3)local_54);
        bVar9 = bVar8 >> 4 & 3 | cVar2 << 2;
        bVar8 = bVar3 >> 2 & 0xf | bVar8 << 4;
        cVar10 = bVar3 * '@' + cVar10;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                  bVar9);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,bVar8
                 );
        uVar7 = 0;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  cVar10);
        lVar6 = local_38;
        this = local_40;
      }
      puVar12 = puVar12 + 1;
    } while (this != puVar12);
    local_58 = (ushort)bVar8 << 8;
    __return_storage_ptr__ = local_50;
    local_56 = cVar10;
  }
  local_58 = CONCAT11(local_58._1_1_,bVar9);
  if (0 < (int)uVar7) {
    if ((int)uVar7 < 4) {
      memset((void *)((long)&local_54 + (ulong)uVar7),0,(ulong)(3 - uVar7) + 1);
    }
    uVar4 = local_54;
    cVar10 = *(char *)((long)&std::__ioinit + (ulong)(byte)local_54 + 1);
    bVar9 = *(byte *)((long)&std::__ioinit + (ulong)local_54._1_1_ + 1);
    local_54._0_2_ = CONCAT11(bVar9,cVar10);
    local_54._2_1_ = SUB41(uVar4,2);
    bVar8 = *(byte *)((long)&std::__ioinit + (ulong)local_54._2_1_ + 1);
    local_54._3_1_ = SUB41(uVar4,3);
    local_54._0_3_ = CONCAT12(bVar8,(undefined2)local_54);
    cVar2 = *(char *)((long)&std::__ioinit + (ulong)local_54._3_1_ + 1);
    local_54 = CONCAT13(cVar2,(undefined3)local_54);
    local_58 = CONCAT11(bVar8 >> 2 & 0xf | bVar9 << 4,bVar9 >> 4 & 3 | cVar10 << 2);
    local_56 = bVar8 * '@' + cVar2;
    if (uVar7 != 1) {
      uVar11 = 2;
      if (2 < (int)uVar7) {
        uVar11 = uVar7;
      }
      uVar13 = 0;
      do {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,*(char *)((long)&local_58 + uVar13));
        uVar13 = uVar13 + 1;
      } while (uVar11 - 1 != uVar13);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    base64_decode_to_string(std::string_view encoded_string, size_t offset)
{
    auto in_len = encoded_string.size();
    int indexOut{0};
    int indexIn{static_cast<int>(offset)};
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};
    std::string ret;
    ret.reserve(in_len);

    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

            ret.push_back(char_array_3[0]);
            ret.push_back(char_array_3[1]);
            ret.push_back(char_array_3[2]);

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            ret.push_back(char_array_3[j]);
        }
    }

    return ret;
}